

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ei_kissfft_impl.h
# Opt level: O0

void __thiscall
Eigen::internal::kissfft_impl<double>::fwd
          (kissfft_impl<double> *this,Complex *dst,Scalar *src,int nfft)

{
  int nfft_00;
  PlanData *this_00;
  reference xout;
  Complex *pCVar1;
  double dVar2;
  double dVar3;
  Scalar extraout_XMM0_Qa;
  Scalar extraout_XMM0_Qa_00;
  undefined4 uVar4;
  undefined4 uVar5;
  double local_130;
  complex<double> local_128;
  complex<double> local_118;
  Scalar local_100;
  double local_f8;
  complex<double> local_f0;
  Scalar local_d8;
  undefined1 local_d0 [8];
  Complex tw;
  Complex f2k;
  Complex f1k;
  Complex fpnk;
  Complex fpk;
  Scalar SStack_78;
  int k;
  Complex nyquist;
  Complex dc;
  Complex *rtw;
  int ncfft2;
  int ncfft;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_40;
  complex<double> *local_38;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_30;
  int local_24;
  Complex *pCStack_20;
  int nfft_local;
  Scalar *src_local;
  Complex *dst_local;
  kissfft_impl<double> *this_local;
  
  local_24 = nfft;
  pCStack_20 = (Complex *)src;
  src_local = (Scalar *)dst;
  dst_local = (Complex *)this;
  if ((nfft & 3U) == 0) {
    nfft_00 = nfft >> 1;
    pCVar1 = real_twiddles(this,nfft >> 2);
    fwd(this,(Complex *)src_local,pCStack_20,nfft_00);
    dVar2 = std::complex<double>::real_abi_cxx11_((complex<double> *)src_local);
    dVar3 = std::complex<double>::imag_abi_cxx11_((complex<double> *)src_local);
    std::complex<double>::complex((complex<double> *)(nyquist._M_value + 8),dVar2 + dVar3,0.0);
    dVar2 = std::complex<double>::real_abi_cxx11_((complex<double> *)src_local);
    dVar3 = std::complex<double>::imag_abi_cxx11_((complex<double> *)src_local);
    uVar4 = 0;
    uVar5 = 0;
    std::complex<double>::complex((complex<double> *)&stack0xffffffffffffff88,dVar2 - dVar3,0.0);
    for (fpk._M_value._12_4_ = 1; (int)fpk._M_value._12_4_ <= nfft >> 2;
        fpk._M_value._12_4_ = fpk._M_value._12_4_ + 1) {
      fpnk._M_value._8_8_ = src_local[(long)(int)fpk._M_value._12_4_ * 2];
      std::conj<double>((complex<double> *)(src_local + (long)(nfft_00 - fpk._M_value._12_4_) * 2));
      fpnk._M_value._4_4_ = uVar5;
      fpnk._M_value._0_4_ = uVar4;
      std::operator+((complex<double> *)(fpnk._M_value + 8),(complex<double> *)(f1k._M_value + 8));
      f1k._M_value._4_4_ = uVar5;
      f1k._M_value._0_4_ = uVar4;
      std::operator-((complex<double> *)(fpnk._M_value + 8),(complex<double> *)(f1k._M_value + 8));
      f2k._M_value._4_4_ = uVar5;
      f2k._M_value._0_4_ = uVar4;
      std::operator*((complex<double> *)(tw._M_value + 8),pCVar1 + (fpk._M_value._12_4_ + -1));
      tw._M_value._4_4_ = uVar5;
      tw._M_value._0_4_ = uVar4;
      std::operator+((complex<double> *)(f2k._M_value + 8),(complex<double> *)local_d0);
      local_f0._M_value._12_4_ = uVar5;
      local_f0._M_value._8_4_ = uVar4;
      local_f8 = 0.5;
      std::operator*(&local_f0,&local_f8);
      local_d8 = (Scalar)CONCAT44(uVar5,uVar4);
      src_local[(long)(int)fpk._M_value._12_4_ * 2] = extraout_XMM0_Qa;
      (src_local + (long)(int)fpk._M_value._12_4_ * 2)[1] = local_d8;
      std::operator-((complex<double> *)(f2k._M_value + 8),(complex<double> *)local_d0);
      local_128._M_value._12_4_ = uVar5;
      local_128._M_value._8_4_ = uVar4;
      std::conj<double>(&local_128);
      local_118._M_value._12_4_ = uVar5;
      local_118._M_value._8_4_ = uVar4;
      local_130 = 0.5;
      std::operator*(&local_118,&local_130);
      local_100 = (Scalar)CONCAT44(uVar5,uVar4);
      src_local[(long)(nfft_00 - fpk._M_value._12_4_) * 2] = extraout_XMM0_Qa_00;
      (src_local + (long)(nfft_00 - fpk._M_value._12_4_) * 2)[1] = local_100;
    }
    *src_local = (Scalar)nyquist._M_value._8_8_;
    src_local[1] = (Scalar)dc._M_value._0_8_;
    src_local[(long)nfft_00 * 2] = SStack_78;
    (src_local + (long)nfft_00 * 2)[1] = (Scalar)nyquist._M_value._0_8_;
  }
  else {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (&this->m_tmpBuf1,(long)nfft);
    this_00 = get_plan(this,local_24,false);
    xout = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                     (&this->m_tmpBuf1,0);
    kiss_cpx_fft<double>::work<double>(this_00,0,xout,(double *)pCStack_20,1,1);
    local_30._M_current =
         (complex<double> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                   (&this->m_tmpBuf1);
    _ncfft2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                        (&this->m_tmpBuf1);
    local_40 = __gnu_cxx::
               __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator+((__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                            *)&ncfft2,(long)(local_24 >> 1));
    local_38 = (complex<double> *)
               __gnu_cxx::
               __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
               ::operator+(&local_40,1);
    std::
    copy<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,std::complex<double>*>
              (local_30,(__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                         )local_38,(complex<double> *)src_local);
  }
  return;
}

Assistant:

inline
    void fwd( Complex * dst,const Scalar * src,int nfft) 
    {
      if ( nfft&3  ) {
        // use generic mode for odd
        m_tmpBuf1.resize(nfft);
        get_plan(nfft,false).work(0, &m_tmpBuf1[0], src, 1,1);
        std::copy(m_tmpBuf1.begin(),m_tmpBuf1.begin()+(nfft>>1)+1,dst );
      }else{
        int ncfft = nfft>>1;
        int ncfft2 = nfft>>2;
        Complex * rtw = real_twiddles(ncfft2);

        // use optimized mode for even real
        fwd( dst, reinterpret_cast<const Complex*> (src), ncfft);
        Complex dc(dst[0].real() +  dst[0].imag());
        Complex nyquist(dst[0].real() -  dst[0].imag());
        int k;
        for ( k=1;k <= ncfft2 ; ++k ) {
          Complex fpk = dst[k];
          Complex fpnk = conj(dst[ncfft-k]);
          Complex f1k = fpk + fpnk;
          Complex f2k = fpk - fpnk;
          Complex tw= f2k * rtw[k-1];
          dst[k] =  (f1k + tw) * Scalar(.5);
          dst[ncfft-k] =  conj(f1k -tw)*Scalar(.5);
        }
        dst[0] = dc;
        dst[ncfft] = nyquist;
      }
    }